

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O2

VkResult vk::wsi::createSurface
                   (InstanceInterface *vki,VkInstance instance,Type wsiType,Display *nativeDisplay,
                   Window *nativeWindow,VkAllocationCallbacks *pAllocator,VkSurfaceKHR *pSurface)

{
  VkResult VVar1;
  long lVar2;
  long lVar3;
  undefined4 local_58 [2];
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  switch(wsiType) {
  case TYPE_XLIB:
    lVar2 = __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<0>::typeinfo,0);
    if ((lVar2 == 0) ||
       (lVar3 = __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<0>::typeinfo,0),
       lVar3 == 0)) {
LAB_008aa942:
      __cxa_bad_cast();
    }
    local_58[0] = 0x3b9ad9a0;
    local_50 = 0;
    local_48 = 0;
    local_40 = *(undefined8 *)(lVar2 + 8);
    local_38 = *(undefined8 *)(lVar3 + 8);
    VVar1 = (*vki->_vptr_InstanceInterface[0x19])(vki,instance,local_58,pAllocator,pSurface);
    break;
  case TYPE_XCB:
    lVar2 = __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<1>::typeinfo,0);
    if ((lVar2 == 0) ||
       (lVar3 = __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<1>::typeinfo,0),
       lVar3 == 0)) goto LAB_008aa942;
    local_58[0] = 0x3b9add88;
    local_50 = 0;
    local_48 = 0;
    local_40 = *(undefined8 *)(lVar2 + 8);
    local_38 = *(undefined8 *)(lVar3 + 8);
    VVar1 = (*vki->_vptr_InstanceInterface[0x1b])(vki,instance,local_58,pAllocator,pSurface);
    break;
  case TYPE_WAYLAND:
    lVar2 = __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<2>::typeinfo,0);
    if ((lVar2 == 0) ||
       (lVar3 = __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<2>::typeinfo,0),
       lVar3 == 0)) goto LAB_008aa942;
    local_58[0] = 0x3b9ae170;
    local_50 = 0;
    local_48 = 0;
    local_40 = *(undefined8 *)(lVar2 + 8);
    local_38 = *(undefined8 *)(lVar3 + 8);
    VVar1 = (*vki->_vptr_InstanceInterface[0x1d])(vki,instance,local_58,pAllocator,pSurface);
    break;
  case TYPE_MIR:
    lVar2 = __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<3>::typeinfo,0);
    if ((lVar2 == 0) ||
       (lVar3 = __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<3>::typeinfo,0),
       lVar3 == 0)) goto LAB_008aa942;
    local_58[0] = 0x3b9ae558;
    local_50 = 0;
    local_48 = 0;
    local_40 = *(undefined8 *)(lVar2 + 8);
    local_38 = *(undefined8 *)(lVar3 + 8);
    VVar1 = (*vki->_vptr_InstanceInterface[0x1f])(vki,instance,local_58,pAllocator,pSurface);
    break;
  case TYPE_ANDROID:
    lVar2 = __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<4>::typeinfo,0);
    if (lVar2 == 0) goto LAB_008aa942;
    local_58[0] = 0x3b9ae940;
    local_50 = 0;
    local_48 = 0;
    local_40 = *(undefined8 *)(lVar2 + 8);
    VVar1 = (*vki->_vptr_InstanceInterface[0x21])(vki,instance,local_58,pAllocator,pSurface);
    break;
  case TYPE_WIN32:
    lVar2 = __dynamic_cast(nativeDisplay,&Display::typeinfo,&DisplayInterface<5>::typeinfo,0);
    if ((lVar2 == 0) ||
       (lVar3 = __dynamic_cast(nativeWindow,&Window::typeinfo,&WindowInterface<5>::typeinfo,0),
       lVar3 == 0)) goto LAB_008aa942;
    local_58[0] = 0x3b9aed28;
    local_50 = 0;
    local_48 = 0;
    local_40 = *(undefined8 *)(lVar2 + 8);
    local_38 = *(undefined8 *)(lVar3 + 8);
    VVar1 = (*vki->_vptr_InstanceInterface[0x22])(vki,instance,local_58,pAllocator,pSurface);
    break;
  default:
    VVar1 = VK_ERROR_SURFACE_LOST_KHR;
  }
  return VVar1;
}

Assistant:

VkResult createSurface (const InstanceInterface&		vki,
						VkInstance						instance,
						Type							wsiType,
						const Display&					nativeDisplay,
						const Window&					nativeWindow,
						const VkAllocationCallbacks*	pAllocator,
						VkSurfaceKHR*					pSurface)
{
	// Update this function if you add more WSI implementations
	DE_STATIC_ASSERT(TYPE_LAST == 6);

	switch (wsiType)
	{
		case TYPE_XLIB:
		{
			const XlibDisplayInterface&			xlibDisplay		= dynamic_cast<const XlibDisplayInterface&>(nativeDisplay);
			const XlibWindowInterface&			xlibWindow		= dynamic_cast<const XlibWindowInterface&>(nativeWindow);
			const VkXlibSurfaceCreateInfoKHR	createInfo		=
			{
				VK_STRUCTURE_TYPE_XLIB_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkXlibSurfaceCreateFlagsKHR)0,
				xlibDisplay.getNative(),
				xlibWindow.getNative()
			};

			return vki.createXlibSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_XCB:
		{
			const XcbDisplayInterface&			xcbDisplay		= dynamic_cast<const XcbDisplayInterface&>(nativeDisplay);
			const XcbWindowInterface&			xcbWindow		= dynamic_cast<const XcbWindowInterface&>(nativeWindow);
			const VkXcbSurfaceCreateInfoKHR		createInfo		=
			{
				VK_STRUCTURE_TYPE_XCB_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkXcbSurfaceCreateFlagsKHR)0,
				xcbDisplay.getNative(),
				xcbWindow.getNative()
			};

			return vki.createXcbSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_WAYLAND:
		{
			const WaylandDisplayInterface&		waylandDisplay	= dynamic_cast<const WaylandDisplayInterface&>(nativeDisplay);
			const WaylandWindowInterface&		waylandWindow	= dynamic_cast<const WaylandWindowInterface&>(nativeWindow);
			const VkWaylandSurfaceCreateInfoKHR	createInfo		=
			{
				VK_STRUCTURE_TYPE_WAYLAND_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkWaylandSurfaceCreateFlagsKHR)0,
				waylandDisplay.getNative(),
				waylandWindow.getNative()
			};

			return vki.createWaylandSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_MIR:
		{
			const MirDisplayInterface&			mirDisplay		= dynamic_cast<const MirDisplayInterface&>(nativeDisplay);
			const MirWindowInterface&			mirWindow		= dynamic_cast<const MirWindowInterface&>(nativeWindow);
			const VkMirSurfaceCreateInfoKHR		createInfo		=
			{
				VK_STRUCTURE_TYPE_MIR_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkXcbSurfaceCreateFlagsKHR)0,
				mirDisplay.getNative(),
				mirWindow.getNative()
			};

			return vki.createMirSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_ANDROID:
		{
			const AndroidWindowInterface&		androidWindow	= dynamic_cast<const AndroidWindowInterface&>(nativeWindow);
			const VkAndroidSurfaceCreateInfoKHR	createInfo		=
			{
				VK_STRUCTURE_TYPE_ANDROID_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkAndroidSurfaceCreateFlagsKHR)0,
				androidWindow.getNative()
			};

			return vki.createAndroidSurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		case TYPE_WIN32:
		{
			const Win32DisplayInterface&		win32Display	= dynamic_cast<const Win32DisplayInterface&>(nativeDisplay);
			const Win32WindowInterface&			win32Window		= dynamic_cast<const Win32WindowInterface&>(nativeWindow);
			const VkWin32SurfaceCreateInfoKHR	createInfo		=
			{
				VK_STRUCTURE_TYPE_WIN32_SURFACE_CREATE_INFO_KHR,
				DE_NULL,
				(VkWin32SurfaceCreateFlagsKHR)0,
				win32Display.getNative(),
				win32Window.getNative()
			};

			return vki.createWin32SurfaceKHR(instance, &createInfo, pAllocator, pSurface);
		}

		default:
			DE_FATAL("Unknown WSI type");
			return VK_ERROR_SURFACE_LOST_KHR;
	}
}